

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FileDescriptor *file;
  ulong uVar6;
  size_t sVar7;
  size_type sVar8;
  reference ppFVar9;
  pointer pvVar10;
  FieldGenerator *pFVar11;
  string *args;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  Iterator IVar12;
  int local_1ec;
  value_type pOStack_1e8;
  int i_2;
  value_type oneof;
  Iterator __end4;
  Iterator __begin4;
  OneOfRangeImpl *__range4;
  string local_1a8;
  allocator local_181;
  string local_180;
  undefined1 local_160 [8];
  string last_field_name;
  string first_field_name;
  size_t run_length;
  _Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
  local_110;
  const_iterator it;
  FieldDescriptor *field;
  anon_class_8_1_8991fb9c aStack_f8;
  int i_1;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> local_f0;
  undefined1 local_d0 [8];
  RunMap runs;
  undefined1 local_90 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>
              ((Formatter *)local_50,"void $classname$::InternalSwap($classname$* other) {\n");
    Formatter::Indent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"using std::swap;\n");
    file = Descriptor::file(this->descriptor_);
    bVar2 = HasGeneratedMethods(file,&this->options_);
    if (bVar2) {
      iVar4 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar4) {
        Formatter::operator()<>
                  ((Formatter *)local_50,"_extensions_.InternalSwap(&other->_extensions_);\n");
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_90);
      SetUnknownFieldsVariable
                (this->descriptor_,&this->options_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_90);
      Formatter::AddMap((Formatter *)local_50,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_90);
      bVar2 = anon_unknown_0::HasSingularString(this->descriptor_,&this->options_);
      if (bVar2) {
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "auto* lhs_arena = GetArenaForAllocation();\nauto* rhs_arena = other->GetArenaForAllocation();\n"
                  );
      }
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");
      bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
      if (!bVar2) {
        for (runs._M_h._M_single_bucket._4_4_ = 0; uVar6 = (ulong)runs._M_h._M_single_bucket._4_4_,
            sVar7 = HasBitsSize(this), uVar6 < sVar7;
            runs._M_h._M_single_bucket._4_4_ = runs._M_h._M_single_bucket._4_4_ + 1) {
          Formatter::operator()
                    ((Formatter *)local_50,"swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n",
                     (int *)((long)&runs._M_h._M_single_bucket + 4));
        }
      }
      aStack_f8.this = this;
      std::function<bool(google::protobuf::FieldDescriptor_const*)>::
      function<google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap(google::protobuf::io::Printer*)::__0,void>
                ((function<bool(google::protobuf::FieldDescriptor_const*)> *)&local_f0,
                 &stack0xffffffffffffff08);
      anon_unknown_0::FindRuns((RunMap *)local_d0,&this->optimized_order_,&local_f0);
      std::function<bool_(const_google::protobuf::FieldDescriptor_*)>::~function(&local_f0);
      for (field._4_4_ = 0;
          sVar8 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(&this->optimized_order_), (ulong)(long)field._4_4_ < sVar8;
          field._4_4_ = field._4_4_ + 1) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)field._4_4_);
        it.
        super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                   )*ppFVar9;
        local_110._M_cur =
             (__node_type *)
             std::
             unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
             ::find((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                     *)local_d0,(key_type *)&it);
        run_length = (size_t)std::
                             unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                             ::end((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                                    *)local_d0);
        bVar3 = std::__detail::operator!=
                          (&local_110,
                           (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                            *)&run_length);
        bVar2 = false;
        if (bVar3) {
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                    ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                                  *)&local_110);
          bVar2 = 1 < pvVar10->second;
        }
        if (bVar2) {
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                    ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                                  *)&local_110);
          uVar1 = pvVar10->second;
          FieldName_abi_cxx11_
                    ((string *)((long)&last_field_name.field_2 + 8),
                     (cpp *)it.
                            super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                            ._M_cur,field_00);
          ppFVar9 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::operator[](&this->optimized_order_,(long)field._4_4_ + -1 + uVar1);
          FieldName_abi_cxx11_((string *)local_160,(cpp *)*ppFVar9,field_01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_180,"first",&local_181);
          Formatter::Set<std::__cxx11::string>
                    ((Formatter *)local_50,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&last_field_name.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a8,"last",(allocator *)((long)&__range4 + 7));
          Formatter::Set<std::__cxx11::string>
                    ((Formatter *)local_50,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
          ;
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          Formatter::operator()<>
                    ((Formatter *)local_50,
                     "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n    + sizeof($classname$::$last$_)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n        reinterpret_cast<char*>(&$first$_),\n        reinterpret_cast<char*>(&other->$first$_));\n"
                    );
          field._4_4_ = field._4_4_ + (int)uVar1 + -1;
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)(last_field_name.field_2._M_local_buf + 8));
        }
        else {
          pFVar11 = FieldGeneratorMap::get
                              (&this->field_generators_,
                               (FieldDescriptor *)
                               it.
                               super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                               ._M_cur);
          (*pFVar11->_vptr_FieldGenerator[0xe])
                    (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      __begin4.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
      IVar12 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin4.descriptor);
      __begin4._0_8_ = IVar12.descriptor;
      __end4.descriptor._0_4_ = IVar12.idx;
      IVar12 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin4.descriptor);
      __end4._0_8_ = IVar12.descriptor;
      oneof._0_4_ = IVar12.idx;
      while (bVar2 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&oneof), bVar2) {
        pOStack_1e8 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end4.descriptor);
        args = OneofDescriptor::name_abi_cxx11_(pOStack_1e8);
        Formatter::operator()((Formatter *)local_50,"swap($1$_, other->$1$_);\n",args);
        OneOfRangeImpl::Iterator::operator++((Iterator *)&__end4.descriptor);
      }
      for (local_1ec = 0; iVar4 = local_1ec,
          iVar5 = Descriptor::real_oneof_decl_count(this->descriptor_), iVar4 < iVar5;
          local_1ec = local_1ec + 1) {
        Formatter::operator()
                  ((Formatter *)local_50,"swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n",
                   &local_1ec);
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
      }
      std::
      unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
      ::~unordered_map((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                        *)local_d0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_90);
    }
    else {
      Formatter::operator()<>((Formatter *)local_50,"GetReflection()->Swap(this, other);");
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"}\n");
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("void $classname$::InternalSwap($classname$* other) {\n");
  format.Indent();
  format("using std::swap;\n");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format("_extensions_.InternalSwap(&other->_extensions_);\n");
    }

    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    if (HasSingularString(descriptor_, options_)) {
      format(
          "auto* lhs_arena = GetArenaForAllocation();\n"
          "auto* rhs_arena = other->GetArenaForAllocation();\n");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (int i = 0; i < HasBitsSize(); ++i) {
        format("swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_);
        });

    for (int i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name = FieldName(field);
        const std::string last_field_name =
            FieldName(optimized_order_[i + run_length - 1]);

        format.Set("first", first_field_name);
        format.Set("last", last_field_name);

        format(
            "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n"
            "    + sizeof($classname$::$last$_)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n"
            "        reinterpret_cast<char*>(&$first$_),\n"
            "        reinterpret_cast<char*>(&other->$first$_));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(printer);
      }
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap($1$_, other->$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      format("swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format("_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}